

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::DoubleParameter::ByteSizeLong(DoubleParameter *this)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar4 = (ulong)(-(uint)(this->defaultvalue_ != 0.0) & 1) * 9;
  if (this->_oneof_case_[0] == 10) {
    sVar3 = DoubleRange::ByteSizeLong((this->AllowedValues_).range_);
    uVar2 = (uint)sVar3 | 1;
    iVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar4 = sVar4 + sVar3 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t DoubleParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.DoubleParameter)
  size_t total_size = 0;

  // double defaultValue = 1;
  if (this->defaultvalue() != 0) {
    total_size += 1 + 8;
  }

  switch (AllowedValues_case()) {
    // .CoreML.Specification.DoubleRange range = 10;
    case kRange: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *AllowedValues_.range_);
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}